

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O1

void __thiscall
highwayhash::HighwayHashTest<1U>::operator()
          (HighwayHashTest<1U> *this,HHKey *key,char *bytes,size_t size,HHResult64 *expected,
          HHNotify notify)

{
  int i;
  long lVar1;
  char *pcVar2;
  Lanes rotated_keys;
  HHStateT<1U> state;
  HHResult64 local_c8 [5];
  HHStatePortable local_a0;
  
  lVar1 = 0;
  do {
    local_c8[lVar1] = (*key)[lVar1] << 0x20 | (*key)[lVar1] >> 0x20;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_a0.mul0[2] = 0x13198a2e03707344;
  local_a0.mul0[3] = 0x243f6a8885a308d3;
  local_a0.mul0[0] = 0xdbe6d5d5fe4cce2f;
  local_a0.mul0[1] = 0xa4093822299f31d0;
  local_a0.mul1[0] = 0x3bd39e10cb0ef593;
  local_a0.mul1[1] = 0xc0acf169b5f18a8c;
  local_a0.mul1[2] = 0xbe5466cf34e90c6c;
  local_a0.mul1[3] = 0x452821e638d01377;
  lVar1 = 0;
  do {
    *(ulong *)((long)local_a0.v0 + lVar1) =
         *(ulong *)((long)*key + lVar1) ^
         *(ulong *)((long)&Portable::HHStatePortable::Reset(unsigned_long_const*)::init0 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  lVar1 = 0;
  do {
    *(ulong *)((long)local_a0.v1 + lVar1) =
         *(ulong *)((long)local_c8 + lVar1) ^
         *(ulong *)((long)&Portable::HHStatePortable::Reset(unsigned_long_const*)::init1 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  HighwayHashT<highwayhash::Portable::HHStatePortable,unsigned_long>(&local_a0,bytes,size,local_c8);
  if (*expected != local_c8[0]) {
    pcVar2 = TargetName(1);
    (*notify)(pcVar2,size);
  }
  return;
}

Assistant:

void HighwayHashTest<Target>::operator()(const HHKey& key,
                                         const char* HH_RESTRICT bytes,
                                         const size_t size,
                                         const HHResult64* expected,
                                         const HHNotify notify) const {
  HHStateT<Target> state(key);
  TestHighwayHash(&state, bytes, size, expected, notify);
}